

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_test.c
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int *piVar8;
  ulong uVar9;
  uint uVar10;
  int *piVar11;
  size_t __size;
  ulong uVar12;
  int iVar13;
  int iVar15;
  double dVar14;
  int iVar16;
  int iVar17;
  int hiC [2];
  int rank;
  int loC [2];
  int ld;
  int hiA [2];
  int loA [2];
  int hiB [2];
  int lds;
  int ldC;
  int lda;
  int ldb;
  int loB [2];
  int bhi [2];
  int ahi [2];
  int pdy;
  int pdx;
  int nprocs;
  int one;
  int dims [2];
  int blo [2];
  int alo [2];
  int local_170;
  int iStack_16c;
  uint local_164;
  ulong local_160;
  uint local_158 [3];
  int local_14c;
  ulong local_148;
  void *local_140;
  int local_134;
  int local_130;
  int iStack_12c;
  ulong local_128;
  undefined8 local_120;
  int local_118;
  uint local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int *local_100;
  void *local_f8;
  int local_ec;
  int local_e8;
  int local_e4;
  uint local_e0;
  uint local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  undefined8 local_c8;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8 [2];
  void *local_a0;
  int local_98;
  int local_94;
  int local_90 [4];
  double local_80;
  void *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined1 local_3c [4];
  undefined1 local_38 [8];
  
  local_a8[1] = 1;
  MPI_Init(local_3c,local_38);
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_164);
  MPI_Comm_size(&ompi_mpi_comm_world,local_a8);
  MA_init(0x3e9,1000,1000);
  GA_Initialize();
  local_a8[0] = GA_Nnodes();
  local_164 = GA_Nodeid();
  uVar3 = 0;
  do {
    local_128 = (ulong)uVar3;
    local_160 = 4;
    do {
      if (local_164 == 0) {
        fprintf(_stderr,"dim:%d start\n",local_160);
      }
      local_d0 = (int)local_160;
      uVar3 = local_d0 * local_d0;
      uVar6 = (ulong)uVar3;
      local_90[2] = 0;
      local_90[3] = 0;
      local_170 = local_d0 + -1;
      local_90[0] = 0;
      local_90[1] = 0;
      local_158[0] = 0;
      local_158[1] = 0;
      local_120 = 0;
      local_c8 = 0;
      iStack_16c = local_170;
      local_130 = local_170;
      iStack_12c = local_170;
      local_118 = local_170;
      local_108 = local_170;
      local_104 = local_170;
      local_cc = local_d0;
      local_c0 = local_170;
      local_bc = local_170;
      local_b8 = local_170;
      local_b4 = local_170;
      local_98 = local_d0;
      local_94 = local_d0;
      local_a0 = malloc((ulong)(uVar3 * 4));
      uVar5 = 0;
      if (uVar3 == 0) {
        do {
          *(int *)((long)local_a0 + uVar5 * 4) = (int)uVar5;
          uVar5 = uVar5 + 1;
        } while (uVar6 != uVar5);
      }
      else {
        iVar13 = 0;
        iVar15 = 1;
        iVar16 = 2;
        iVar17 = 3;
        do {
          piVar8 = (int *)((long)local_a0 + uVar5 * 4);
          *piVar8 = iVar13;
          piVar8[1] = iVar15;
          piVar8[2] = iVar16;
          piVar8[3] = iVar17;
          uVar5 = uVar5 + 4;
          iVar13 = iVar13 + 4;
          iVar15 = iVar15 + 4;
          iVar16 = iVar16 + 4;
          iVar17 = iVar17 + 4;
        } while (uVar6 != uVar5);
      }
      pvVar4 = malloc((ulong)(uVar3 * 4));
      uVar5 = 0;
      if (uVar6 == 0) {
        do {
          *(int *)((long)pvVar4 + uVar5 * 4) = (int)uVar5;
          uVar5 = uVar5 + 1;
        } while (uVar5 != 0);
      }
      else {
        iVar13 = 0;
        iVar15 = 1;
        iVar16 = 2;
        iVar17 = 3;
        do {
          piVar8 = (int *)((long)pvVar4 + uVar5 * 4);
          *piVar8 = iVar13;
          piVar8[1] = iVar15;
          piVar8[2] = iVar16;
          piVar8[3] = iVar17;
          uVar5 = uVar5 + 4;
          iVar13 = iVar13 + 4;
          iVar15 = iVar15 + 4;
          iVar16 = iVar16 + 4;
          iVar17 = iVar17 + 4;
        } while (uVar6 != uVar5);
      }
      iVar13 = NGA_Create(0x3e9,2,&local_98,"array_A",(int *)0x0);
      iVar15 = NGA_Create(0x3e9,2,&local_98,"array_B",(int *)0x0);
      iVar16 = NGA_Create(0x3e9,2,&local_98,"array_C",(int *)0x0);
      GA_Zero(iVar13);
      GA_Zero(iVar15);
      local_10c = iVar16;
      GA_Zero(iVar16);
      local_158[2] = iVar13;
      NGA_Put(iVar13,local_90 + 2,&local_b8,local_a0,&local_d0);
      local_14c = iVar15;
      local_78 = pvVar4;
      NGA_Put(iVar15,local_90,&local_c0,pvVar4,&local_cc);
      GA_Sync();
      iVar13 = (int)local_128;
      if (iVar13 == 0) {
        NGA_Set_property(local_158[2],"read_only");
        NGA_Set_property(local_14c,"read_only");
        iVar13 = (int)local_128;
      }
      if (iVar13 == 1) {
        NGA_Set_property(local_158[2],"read_cache");
        NGA_Set_property(local_14c,"read_cache");
      }
      GA_Sync();
      local_80 = GA_Wtime();
      grid_factor(local_a8[0],&local_ac,&local_b0);
      local_e4 = local_ac;
      lVar1 = (long)local_ac;
      lVar2 = (long)(int)local_164;
      local_114 = (int)local_164 % local_ac;
      uVar5 = lVar2 / lVar1 & 0xffffffff;
      uVar6 = local_160 >> 1 & 0x7fffffff;
      iVar13 = (int)((local_160 & 0xffffffff) / uVar6);
      local_110 = (int)uVar6;
      iVar13 = iVar13 + (uint)((uint)(iVar13 * local_110) < (uint)local_160);
      GA_Sync();
      local_e8 = iVar13;
      if ((int)(lVar2 / lVar1) < iVar13) {
        local_ec = local_b0;
        uVar3 = local_114;
        do {
          local_158[1] = (int)uVar5 * local_110;
          local_158[0] = uVar3 * local_110;
          iVar13 = (uVar3 + 1) * local_110;
          local_170 = iVar13 + -1;
          iStack_16c = ((int)uVar5 + 1) * local_110 + -1;
          if ((int)(uint)local_160 < iVar13) {
            local_170 = local_118;
          }
          if ((int)(uint)local_160 <= local_170) {
            local_170 = local_118;
          }
          local_68 = uVar5;
          if (local_170 < (int)(uVar3 * local_110)) {
            fprintf(_stderr,"%d: bad values for HiC LoC: %d  %d\n",(ulong)local_164);
            fprintf(_stderr,"%dL xcnt xbl: %d  %d\n",(ulong)local_164,(ulong)uVar3);
            GA_Error("cache_test: div by zero",0);
          }
          uVar10 = local_158[0];
          iVar16 = (local_170 - local_158[0]) + 1;
          iVar15 = (int)local_160;
          iVar13 = (int)((long)((ulong)(uint)(iVar15 >> 0x1f) << 0x20 | local_160 & 0xffffffff) /
                        (long)iVar16);
          local_148 = CONCAT44(local_148._4_4_,iVar13);
          iVar17 = (iStack_16c - local_158[1]) + 1;
          __size = (size_t)(iVar16 * iVar17 * 4);
          local_70 = (ulong)uVar3;
          local_140 = malloc(__size);
          local_f8 = malloc(__size);
          local_100 = (int *)malloc(__size);
          local_60 = (long)(int)uVar10 / (long)iVar16 & 0xffffffff;
          uVar10 = (uint)(iVar16 * iVar13 < iVar15);
          uVar3 = uVar10 + (int)local_148;
          local_d4 = iVar17;
          if (uVar3 != 0 && SCARRY4(uVar10,(int)local_148) == (int)uVar3 < 0) {
            uVar5 = 0;
            local_e0 = uVar3;
            do {
              iVar13 = ((int)local_60 + (int)uVar5) % (int)local_e0;
              local_130 = local_170;
              local_134 = (local_170 - local_158[0]) + 1;
              iStack_12c = local_134 * iVar13 + local_90[3];
              local_120 = CONCAT44(iStack_12c,local_158[0]);
              iStack_12c = iStack_12c + (local_170 - local_158[0]);
              if (local_b4 <= iStack_12c) {
                iStack_12c = local_b4;
              }
              local_58 = uVar5;
              NGA_Get(local_158[2],(int *)&local_120,&local_130,local_f8,&local_134);
              if (4 < (uint)local_160) {
                pvVar4 = malloc((long)(int)(((local_158[1] ^ 0xffffffff) + iStack_16c) *
                                           ((local_158[0] ^ 0xffffffff) + local_170)) << 2);
                local_50 = CONCAT44(iStack_12c + -1,local_130 + -1);
                local_d8 = (local_130 + -1) - (int)local_120;
                local_48 = CONCAT44((int)((ulong)local_120 >> 0x20) + 1,(int)local_120 + 1);
                NGA_Get(local_158[2],(int *)&local_48,(int *)&local_50,pvVar4,&local_d8);
              }
              local_104 = iStack_16c;
              iVar13 = ((local_170 - local_158[0]) + 1) * iVar13 + local_90[0];
              local_c8 = CONCAT44(SUB84(local_158._0_8_,4),iVar13);
              local_108 = (local_170 - local_158[0]) + iVar13;
              if (local_c0 <= local_108) {
                local_108 = local_c0;
              }
              local_134 = (local_108 - iVar13) + 1;
              NGA_Get(local_14c,(int *)&local_c8,&local_108,local_100,&local_134);
              iVar13 = iStack_16c - local_158[1];
              uVar5 = (ulong)(iVar13 + 1U);
              uVar3 = local_170 - local_158[0];
              local_148 = (ulong)uVar3;
              if (-1 < (int)uVar3) {
                uVar6 = (ulong)(uVar3 + 1);
                uVar7 = 0;
                do {
                  if (-1 < iVar13) {
                    memset((void *)((long)local_140 + uVar7 * 4),0,uVar5 * 4);
                  }
                  uVar7 = (ulong)((int)uVar7 + iVar13 + 1U);
                  uVar6 = uVar6 - 1;
                } while (uVar6 != 0);
              }
              if (-1 < (int)local_148) {
                local_dc = (iStack_12c - local_120._4_4_) + 1;
                local_148 = (ulong)((int)local_148 + 1);
                uVar6 = 0;
                uVar7 = 0;
                do {
                  if (-1 < iVar13) {
                    uVar9 = 0;
                    piVar8 = local_100;
                    do {
                      if (-1 < iStack_12c - local_120._4_4_) {
                        iVar15 = *(int *)((long)local_140 + uVar9 * 4 + uVar7 * uVar5 * 4);
                        uVar12 = 0;
                        piVar11 = piVar8;
                        do {
                          iVar15 = iVar15 + *piVar11 *
                                            *(int *)((long)local_f8 + uVar12 * 4 + uVar6 * 4);
                          uVar12 = uVar12 + 1;
                          piVar11 = piVar11 + uVar5;
                        } while (local_dc != uVar12);
                        *(int *)((long)local_140 + uVar9 * 4 + uVar7 * uVar5 * 4) = iVar15;
                      }
                      uVar9 = uVar9 + 1;
                      piVar8 = piVar8 + 1;
                    } while (uVar9 != uVar5);
                  }
                  uVar7 = uVar7 + 1;
                  uVar6 = (ulong)((int)uVar6 + local_dc);
                } while (uVar7 != local_148);
              }
              NGA_Acc(local_10c,(int *)local_158,&local_170,local_140,&local_d4,local_a8 + 1);
              uVar3 = (int)local_58 + 1;
              uVar5 = (ulong)uVar3;
            } while (uVar3 != local_e0);
          }
          free(local_f8);
          free(local_100);
          free(local_140);
          uVar10 = (int)local_70 + local_e4;
          uVar3 = local_114;
          iVar13 = local_ec;
          if ((int)uVar10 < local_e8) {
            uVar3 = uVar10;
            iVar13 = 0;
          }
          uVar5 = (ulong)(uint)(iVar13 + (int)local_68);
        } while (iVar13 + (int)local_68 < local_e8);
      }
      dVar14 = GA_Wtime();
      pvVar4 = (void *)(dVar14 - local_80);
      iVar13 = (int)local_128;
      if (local_164 == 0 && iVar13 == 0) {
        local_140 = pvVar4;
        printf("READ  - DIMSIZE: %5d  Time (us): %7.4f\n",(double)pvVar4 * 1000000.0,local_160);
        iVar13 = (int)local_128;
        pvVar4 = local_140;
      }
      if ((iVar13 == 1) && (local_164 == 0)) {
        printf("CACHE - DIMSIZE: %5d  Time (us): %7.4f\n",(double)pvVar4 * 1000000.0,local_160);
      }
      GA_Sync();
      uVar3 = local_158[2];
      NGA_Unset_property(local_158[2]);
      iVar13 = local_14c;
      NGA_Unset_property(local_14c);
      GA_Destroy(uVar3);
      GA_Destroy(iVar13);
      GA_Destroy(local_10c);
      free(local_a0);
      free(local_78);
      uVar3 = (uint)local_160;
      local_160 = (ulong)(uVar3 * 2);
    } while (uVar3 < 0x801);
    uVar3 = (int)local_128 + 1;
  } while ((int)local_128 == 0);
  GA_Terminate();
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char **argv) {

  int g_a, g_b, g_c;
  int one = 1;
  int rank, nprocs, kdim;
  int i, j, k;
  int ipx, ipy;
  int pdx, pdy;
  int xdim, ydim;
  int xbl, ybl;
  int xcdim, ycdim;
  int xnbl, ynbl;
  int xcnt, ycnt;
  int nb, ind, istart;
  int local_test;
  int ldtest = 5;
  int *local_A = NULL;
  int *local_B = NULL;
  double delta_t;
  int test;
  int dimsize;

  MPI_Init(&argc, &argv);

  MPI_Comm_rank(MPI_COMM_WORLD, &rank);
  MPI_Comm_size(MPI_COMM_WORLD, &nprocs);

  MA_init(C_INT, 1000, 1000);
  GA_Initialize();

  nprocs = GA_Nnodes();  
  rank = GA_Nodeid();   

  for (test = 0; test <= 1; test++) {
    for (dimsize = 4; dimsize <=4096; dimsize *= 2){
      if (rank == 0) fprintf(stderr,"dim:%d start\n",dimsize);

      int *abuf, *bbuf, *cbuf, *ctest;
      int full_size = dimsize*dimsize;
      int alo[DIM] = {dimsize-dimsize,dimsize-dimsize};
      int ahi[DIM] = {dimsize-1,dimsize-1};
      int blo[DIM] = {dimsize-dimsize,dimsize-dimsize};
      int bhi[DIM] = {dimsize-1,dimsize-1};
      int clo[DIM] = {dimsize-dimsize,dimsize-dimsize};
      int chi[DIM] = {dimsize-1,dimsize-1};
      int loC[DIM] = {dimsize-dimsize,dimsize-dimsize};
      int hiC[DIM] = {dimsize-1,dimsize-1};
      int loA[DIM] = {dimsize-dimsize,dimsize-dimsize};
      int hiA[DIM] = {dimsize-1,dimsize-1};
      int loB[DIM] = {dimsize-dimsize,dimsize-dimsize};
      int hiB[DIM] = {dimsize-1,dimsize-1};
      int dims[DIM]={dimsize,dimsize};
      int ldb = hiB[0]-loB[0]+1;
      int ldc = hiC[0]-loC[0]+1;
      int lda = hiA[0]-loA[0]+1;
      int nlo, ldC;

      char* read_only = "read_only";
      char* read_cache = "read_cache";

      //subarray variables
      int sub_size;
      int *fullarray_test = (int*)malloc(full_size*sizeof(int));
      int *subarray_test;
      int loS[DIM], hiS[DIM];
      int lds;

      local_A=(int*)malloc(full_size*sizeof(int));
      for (i=0;i<full_size;i++){
        *(local_A + i) = i;
      }

      local_B=(int*)malloc(full_size*sizeof(int));
      for (i=0; i<full_size; i++){
        *(local_B + i) = i;
      }

      g_a = NGA_Create(C_INT, DIM, dims, "array_A", NULL);
      g_b = NGA_Create(C_INT, DIM, dims, "array_B", NULL);
      g_c = NGA_Create(C_INT, DIM, dims, "array_C", NULL);

      //fill GAs a and b with values to be multipled
      GA_Zero(g_a);
      GA_Zero(g_b);
      GA_Zero(g_c);

      NGA_Put(g_a, alo, ahi, local_A, &lda);
      NGA_Put(g_b, blo, bhi, local_B, &ldb);

      GA_Sync();
 
      if (test == 0) {
      NGA_Set_property(g_a, read_only);
      NGA_Set_property(g_b, read_only);
      }      
      if (test == 1) {
        NGA_Set_property(g_a, read_cache);
        NGA_Set_property(g_b, read_cache);
      }

      GA_Sync();

      delta_t = GA_Wtime();

      grid_factor(nprocs, &pdx, &pdy);

      //coordinates of processor for grid
      ipx = rank%pdx;
      ipy = (rank-ipx)/pdx; 
      xdim = dimsize;
      ydim = dimsize;

      if (dimsize <= 64) {
        xbl = dimsize/2;
        ybl = dimsize/2;
      } else {
        xbl = dimsize/2;
        ybl = dimsize/2;
      }

      //total number of blocks on each dimension
      xnbl = xdim/xbl;
      ynbl = ydim/ybl;
      if ((xnbl * xbl) < xdim) xnbl++;
      if ((ynbl * ybl) < ydim) ynbl++;

      xcnt = ipx;
      ycnt = ipy;

      GA_Sync();

      while (ycnt < ynbl) {
        int num_blocks, offset;
        int elemsize, ld;
        int *a_buf = NULL;
        int *b_buf = NULL;
        int *c_buf = NULL;
        int test_buf;
        int size_a, size_b, size_c;

        loC[0] = xcnt * xbl;
        loC[1] = ycnt * ybl;
        hiC[0] = (xcnt + 1) * xbl - 1;
        hiC[1] = (ycnt + 1) * ybl - 1;

        if (hiC[0] >= xdim) hiC[0] = xdim - 1;
        if (hiC[0] >= ydim) hiC[0] = ydim - 1;

	// stop to avoid FPE
	if ( hiC[0] < loC[0] ){
	  fprintf(stderr,"%d: bad values for HiC LoC: %d  %d\n", rank, hiC[0], loC[0]);
	  fprintf(stderr,"%dL xcnt xbl: %d  %d\n", rank, xcnt, xbl);
	  GA_Error("cache_test: div by zero", 0);
	}
        // Calculating number of blocks for inner dimension
        num_blocks = dimsize/(hiC[0]-loC[0]+1);
        if (num_blocks*(hiC[0]-loC[0]+1) < dimsize) num_blocks++;

        //set up buffers
        offset = 0;
        elemsize = sizeof(int);

        c_buf = (void*)malloc((hiC[0]-loC[0]+1)*(hiC[1]-loC[1]+1)*elemsize);
        a_buf = (void*)malloc((hiC[0]-loC[0]+1)*(hiC[1]-loC[1]+1)*elemsize);
        b_buf = (void*)malloc((hiC[0]-loC[0]+1)*(hiC[1]-loC[1]+1)*elemsize);
        
        test_buf = (hiC[0]-loC[0]+1)*(hiC[1]-loC[1]+1)*elemsize;
        size_c = (hiC[0]-loC[0]+1)*(hiC[1]-loC[1]+1);
        ldC = hiC[1]-loC[1]+1;
        
        // calculate starting block index
        istart = (loC[0]-clo[0])/(hiC[0]-loC[0]+1);
        
        // loop over block pairs
        for (nb=0; nb<num_blocks; nb++) {
          
          ind = istart + nb;
          ind = ind%num_blocks;
          
          nlo = alo[1]+ind*(hiC[0]-loC[0]+1);
          loA[0] = loC[0];
          hiA[0] = hiC[0];
          loA[1] = nlo;
          hiA[1] = loA[1]+(hiC[0]-loC[0]);
          if (hiA[1] > ahi[1]) hiA[1] = ahi[1];
          ld = hiA[0]-loA[0]+1;
          size_a = (hiA[0]-loA[0]+1)*(hiA[1]-loA[1]+1);
          
          NGA_Get(g_a,loA,hiA,a_buf,&ld);       
          
          if (dimsize > 4) {
          sub_size = (hiC[0]-loC[0]-1)*(hiC[1]-loC[1]-1);
          subarray_test = (int*)malloc(sub_size*sizeof(int)); 
          
          loS[0] = loA[0]+1;
          loS[1] = loA[1]+1;
          hiS[0] = hiA[0]-1;
          hiS[1] = hiA[1]-1;
          lds = hiS[0]-loS[0]+1;

          NGA_Get(g_a,loS,hiS,subarray_test,&lds);
          }          

          loB[1] = loC[1];
          hiB[1] = hiC[1];
          nlo = blo[0]+ind*(hiC[0]-loC[0]+1);
          loB[0] = nlo;
          hiB[0] = loB[0]+(hiC[0]-loC[0]);
          if (hiB[0] > bhi[0]) hiB[0] = bhi[0];
          ld = hiB[0]-loB[0]+1;
          size_b = (hiB[0]-loB[0]+1)*(hiB[1]-loB[1]+1);        

          NGA_Get(g_b,loB,hiB,b_buf,&ld);

          xcdim = hiC[0] - loC[0] + 1;
          ycdim = hiC[1] - loC[1] + 1;

          for (i = 0; i < xcdim; i++) {
            for (j = 0; j < ycdim; j++) {
              c_buf[i*ycdim+j] = 0.0;
            }
          }
          //transpose B to reduce page faults
          kdim = hiA[1] - loA[1] + 1;
          for (i = 0; i < xcdim; i++) {
            for (j = 0; j < ycdim; j++) {
              for (k = 0; k < kdim; k++) {
                c_buf[i*ycdim+j] += a_buf[i*kdim+k]*b_buf[k*ycdim+j];
              }
            }
          }

          NGA_Acc(g_c, loC, hiC, c_buf, &ldC, &one);

        }
         
        // multiplication is done, free buffers 
        free(a_buf);
        free(b_buf);
        free(c_buf);

        xcnt += pdx;

        if (xcnt >= xnbl) {
          xcnt = ipx;
          ycnt += pdy;
        }
      }

      delta_t = GA_Wtime()-delta_t;      
      if (dimsize == 0 & rank == 0) printf("\n"); 
      if (test == 0 && rank == 0) printf("READ  - DIMSIZE: %5d  Time (us): %7.4f\n",dimsize,delta_t*1.0e6);
      if (test == 1 && rank == 0) printf("CACHE - DIMSIZE: %5d  Time (us): %7.4f\n",dimsize,delta_t*1.0e6);

      GA_Sync();
      NGA_Unset_property(g_a);
      NGA_Unset_property(g_b);

#if 0 
      /* check multipy for correctness */
      abuf = (int*)malloc(sizeof(int)*dimsize*dimsize);
      bbuf = (int*)malloc(sizeof(int)*dimsize*dimsize);
      cbuf = (int*)malloc(sizeof(int)*dimsize*dimsize);
      ctest = (int*)malloc(sizeof(int)*dimsize*dimsize);
      /* get data from matrices a, b, c */
      NGA_Get(g_a,alo,ahi,abuf,&dimsize);
      NGA_Get(g_b,blo,bhi,bbuf,&dimsize);
      NGA_Get(g_c,clo,chi,ctest,&dimsize);
      for (i=0; i<dimsize; i++) {
        for (j=0; j<dimsize; j++) {
          cbuf[i*dimsize+j] = 0;
          for (k=0; k<dimsize; k++) {
            cbuf[i*dimsize+j] += abuf[i*dimsize+k]*bbuf[k*dimsize+j];
          }
          if (cbuf[i*dimsize+j] != ctest[i*dimsize+j] && rank == 0) {
            printf("mismatch for pair [%d,%d] expected: %d actual: %d\n",i,j,
                cbuf[i*dimsize+j],ctest[i*dimsize+j]);
          }
        }
      }
      free(abuf);
      free(bbuf);
      free(cbuf);
      free(ctest);
#endif

      GA_Destroy(g_a);
      GA_Destroy(g_b);
      GA_Destroy(g_c);
      free(local_A);
      free(local_B);     
    }
  }
  GA_Terminate();
  MPI_Finalize();
}